

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

size_t Corrade::Containers::Implementation::arrayGrowth<unsigned_int>
                 (size_t currentCapacity,size_t desiredCapacity)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = currentCapacity * 4 + 8;
  if (uVar2 < 0x10) {
    lVar1 = 0x10;
  }
  else if (uVar2 < 0x40) {
    lVar1 = uVar2 * 2;
  }
  else {
    lVar1 = uVar2 + (uVar2 >> 1);
  }
  uVar2 = lVar1 - 8U >> 2;
  if (uVar2 <= desiredCapacity) {
    uVar2 = desiredCapacity;
  }
  return uVar2;
}

Assistant:

inline std::size_t arrayGrowth(const std::size_t currentCapacity, const std::size_t desiredCapacity) {
    /** @todo pick a nice value when current = 0 and desired > 1 */
    const std::size_t currentCapacityInBytes = sizeof(T)*currentCapacity + Implementation::AllocatorTraits<T>::Offset;

    /* For small allocations we want to tightly fit into size buckets (8, 16,
       32, 64 bytes), so it's better to double the capacity every time. For
       larger, increase just by 50%. The capacity is calculated including the
       space needed to store the capacity value (so e.g. a 16-byte allocation
       can store two ints, but when it's doubled to 32 bytes, it can store
       six of them). */
    std::size_t grown;
    if(currentCapacityInBytes < DefaultAllocationAlignment)
        grown = DefaultAllocationAlignment;
    else if(currentCapacityInBytes < 64)
        grown = currentCapacityInBytes*2;
    else
        grown = currentCapacityInBytes + currentCapacityInBytes/2;

    const std::size_t candidate = (grown - Implementation::AllocatorTraits<T>::Offset)/sizeof(T);
    return desiredCapacity > candidate ? desiredCapacity : candidate;
}